

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  FuncState *fs;
  int n;
  int iVar1;
  
  fs = ls->fs;
  n = nvars - nexps;
  if (e->k - VCALL < 2) {
    iVar1 = -1;
    if (-1 < n) {
      iVar1 = n;
    }
    luaK_setreturns(fs,e,iVar1 + 1);
    if (0 < n) {
      luaK_reserveregs(fs,iVar1);
      return;
    }
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg(fs,e);
    }
    if (0 < n) {
      iVar1 = fs->freereg;
      luaK_reserveregs(fs,n);
      luaK_nil(fs,iVar1,n);
      return;
    }
  }
  return;
}

Assistant:

static void adjust_assign (LexState *ls, int nvars, int nexps, expdesc *e) {
  FuncState *fs = ls->fs;
  int extra = nvars - nexps;
  if (hasmultret(e->k)) {
    extra++;  /* includes call itself */
    if (extra < 0) extra = 0;
    luaK_setreturns(fs, e, extra);  /* last exp. provides the difference */
    if (extra > 1) luaK_reserveregs(fs, extra-1);
  }
  else {
    if (e->k != VVOID) luaK_exp2nextreg(fs, e);  /* close last expression */
    if (extra > 0) {
      int reg = fs->freereg;
      luaK_reserveregs(fs, extra);
      luaK_nil(fs, reg, extra);
    }
  }
}